

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall
ArchiveSpan_ReadSingleElementSpan_Test::TestBody(ArchiveSpan_ReadSingleElementSpan_Test *this)

{
  TypedExpectation<void_(int_&)> *this_00;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_01;
  _func_int *message;
  array<int,_1UL> a;
  type uninit_buffer;
  MatcherBase<pstore::gsl::span<int,__1L>_> local_178;
  undefined1 local_160 [32];
  MatcherBase<int_&> local_140;
  mock_span_archive archive;
  
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::mock_span_archive(&archive);
  local_140.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int&>::
       GetVTable<testing::internal::MatcherBase<int&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_140.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00187ca0;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_get
            ((MockSpec<void_(int_&)> *)&uninit_buffer,&archive,(Matcher<int_&> *)&local_140);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      ((MockSpec<void_(int_&)> *)&uninit_buffer,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x164,"archive","get (_)");
  a._M_elems[0] = (_Type)0x17;
  testing::Action<void(int&)>::Action<testing::internal::SetArgRefereeAction<0ul,int>,void>
            ((Action<void_(int_&)> *)local_160,(SetArgRefereeAction<0UL,_int> *)&a);
  testing::internal::TypedExpectation<void_(int_&)>::WillOnce
            (this_00,(Action<void_(int_&)> *)local_160);
  std::_Function_base::~_Function_base((_Function_base *)local_160);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)&local_178);
  testing::internal::MatcherBase<int_&>::~MatcherBase(&local_140);
  local_160._8_8_ =
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_160._0_8_ = &PTR__MatcherBase_00187ef8;
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::gmock_getn_mock
            ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)&uninit_buffer,&archive,
             (Matcher<pstore::gsl::span<int,__1L>_> *)local_160);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)&uninit_buffer,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x165,"archive","getn_mock (_)");
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::Times(this_01,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase(&local_178);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)local_160);
  pstore::serialize::flood<pstore::serialize::details::aligned_storage<4ul,4ul>::type>
            (&uninit_buffer);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            (&archive.gmock01_get_281.super_UntypedFunctionMockerBase,&archive,"get");
  testing::internal::FunctionMocker<void_(int_&)>::Invoke
            (&archive.gmock01_get_281,(int *)&uninit_buffer);
  a._M_elems[0] = (_Type)(_Type)uninit_buffer._;
  local_160._0_4_ = 0x17;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&uninit_buffer,"a[0]","23",a._M_elems,(int *)local_160);
  if (uninit_buffer._[0] == '\0') {
    testing::Message::Message((Message *)local_160);
    if (local_178.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (_func_int **)0x0) {
      message = (_func_int *)0x15ae2c;
    }
    else {
      message = *local_178.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x169,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((long *)local_160._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_160._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_178);
  anon_unknown.dwarf_62afb::ArchiveSpan::mock_span_archive::~mock_span_archive(&archive);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSingleElementSpan) {
    using ::testing::_;
    using ::testing::SetArgReferee;

    mock_span_archive archive;
    EXPECT_CALL (archive, get (_)).WillOnce (SetArgReferee<0> (23));
    EXPECT_CALL (archive, getn_mock (_)).Times (0);

    std::array<int, 1> a;
    pstore::serialize::read (archive, ::pstore::gsl::make_span (a));
    EXPECT_EQ (a[0], 23);
}